

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutScript.cpp
# Opt level: O0

void __thiscall NutScript::LoadFromFile(NutScript *this,char *fileName)

{
  byte bVar1;
  Error *this_00;
  istream local_220 [8];
  ifstream file;
  char *fileName_local;
  NutScript *this_local;
  
  std::ifstream::ifstream(local_220);
  std::operator|(_S_bin,_S_in);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)fileName);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    LoadFromStream(this,local_220);
    std::ifstream::close();
    std::ifstream::~ifstream(local_220);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,"Unable to open file: \"%s\"",fileName);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void NutScript::LoadFromFile( const char* fileName )
{
	std::ifstream file;

	file.open(fileName, std::ios_base::binary | std::ios_base::in);
	if (file.fail())
		throw Error("Unable to open file: \"%s\"", fileName);

	try
	{
		LoadFromStream(file);
	}
	catch(...)
	{
		file.close();
		throw;
	}

	file.close();
}